

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::RgbaInputFile::FromYca::setFrameBuffer
          (FromYca *this,Rgba *base,size_t xStride,size_t yStride,string *channelNamePrefix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined1 in_R10B;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  FrameBuffer fb;
  Slice local_68;
  
  if (this->_fbBase == (Rgba *)0x0) {
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    paVar1 = &__str.field_2;
    pcVar2 = (channelNamePrefix->_M_dataplus)._M_p;
    __str._M_dataplus._M_p = (pointer)paVar1;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str,pcVar2,pcVar2 + channelNamePrefix->_M_string_length);
    std::__cxx11::string::append((char *)&__str);
    Slice::Slice(&local_68,HALF,(char *)&this->_tmpBuf[0xd - (long)this->_xMin].g,8,0,1,1,0.5,
                 (bool)in_R10B,false);
    FrameBuffer::insert(&fb,&__str,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    if (this->_readC == true) {
      pcVar2 = (channelNamePrefix->_M_dataplus)._M_p;
      __str._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar2,pcVar2 + channelNamePrefix->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      Slice::Slice(&local_68,HALF,(char *)(this->_tmpBuf + (0xd - (long)this->_xMin)),0x10,0,2,2,0.0
                   ,(bool)in_R10B,false);
      FrameBuffer::insert(&fb,&__str,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar1) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      pcVar2 = (channelNamePrefix->_M_dataplus)._M_p;
      __str._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar2,pcVar2 + channelNamePrefix->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      Slice::Slice(&local_68,HALF,(char *)&this->_tmpBuf[0xd - (long)this->_xMin].b,0x10,0,2,2,0.0,
                   (bool)in_R10B,false);
      FrameBuffer::insert(&fb,&__str,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar1) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar2 = (channelNamePrefix->_M_dataplus)._M_p;
    __str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str,pcVar2,pcVar2 + channelNamePrefix->_M_string_length);
    std::__cxx11::string::append((char *)&__str);
    Slice::Slice(&local_68,HALF,(char *)&this->_tmpBuf[0xd - (long)this->_xMin].a,8,0,1,1,1.0,
                 (bool)in_R10B,false);
    FrameBuffer::insert(&fb,&__str,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    InputPart::setFrameBuffer(this->_inputPart,&fb);
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&fb);
  }
  this->_fbBase = base;
  this->_fbXStride = xStride;
  this->_fbYStride = yStride;
  return;
}

Assistant:

void
RgbaInputFile::FromYca::setFrameBuffer (
    Rgba* base, size_t xStride, size_t yStride, const string& channelNamePrefix)
{
    if (_fbBase == 0)
    {
        FrameBuffer fb;

        fb.insert (
            channelNamePrefix + "Y",
            Slice (
                HALF,                           // type
                (char*) &_tmpBuf[N2 - _xMin].g, // base
                sizeof (Rgba),                  // xStride
                0,                              // yStride
                1,                              // xSampling
                1,                              // ySampling
                0.5));                          // fillValue

        if (_readC)
        {
            fb.insert (
                channelNamePrefix + "RY",
                Slice (
                    HALF,                           // type
                    (char*) &_tmpBuf[N2 - _xMin].r, // base
                    sizeof (Rgba) * 2,              // xStride
                    0,                              // yStride
                    2,                              // xSampling
                    2,                              // ySampling
                    0.0));                          // fillValue

            fb.insert (
                channelNamePrefix + "BY",
                Slice (
                    HALF,                           // type
                    (char*) &_tmpBuf[N2 - _xMin].b, // base
                    sizeof (Rgba) * 2,              // xStride
                    0,                              // yStride
                    2,                              // xSampling
                    2,                              // ySampling
                    0.0));                          // fillValue
        }

        fb.insert (
            channelNamePrefix + "A",
            Slice (
                HALF,                           // type
                (char*) &_tmpBuf[N2 - _xMin].a, // base
                sizeof (Rgba),                  // xStride
                0,                              // yStride
                1,                              // xSampling
                1,                              // ySampling
                1.0));                          // fillValue

        _inputPart.setFrameBuffer (fb);
    }

    _fbBase    = base;
    _fbXStride = xStride;
    _fbYStride = yStride;
}